

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config_delta.c
# Opt level: O1

void handler_add_section(void)

{
  char *__s1;
  int iVar1;
  bool cond;
  _Bool cond_00;
  
  cond = callback_counter == 0;
  callback_counter = callback_counter + 1;
  cunit_named_check(cond,"handler_add_section",0x8f,"Callback was called %d times!");
  if (callback_counter < 2) {
    cunit_named_check(handler_1.pre == (cfg_named_section *)0x0,"handler_add_section",0x93,
                      "Unknown pre named-section found.");
    cunit_named_check(handler_1.post != (cfg_named_section *)0x0,"handler_add_section",0x94,
                      "No post named-section found.");
    if (handler_1.post != (cfg_named_section *)0x0) {
      __s1 = (handler_1.post)->name;
      if (__s1 == (char *)0x0) {
        cond_00 = false;
      }
      else {
        iVar1 = strcmp(__s1,"name_1");
        cond_00 = iVar1 == 0;
      }
      cunit_named_check(cond_00,"handler_add_section",0x9b,"Illegal name of changed section: %s",
                        __s1);
      cunit_named_check(entries_1[0].delta_changed,"handler_add_section",0x9d,
                        "Key 1 did not change!");
      cunit_named_check(entries_1[1].delta_changed,"handler_add_section",0x9e,
                        "Key 2 did not change!");
      cunit_named_check((_Bool)(entries_1[2].delta_changed ^ 1),"handler_add_section",0x9f,
                        "Key 3 did change!");
      iVar1 = strarray_cmp(entries_1[0].post,&value_1);
      cunit_named_check(iVar1 == 0,"handler_add_section",0xa2,"Unknown post data for key 1: %s",
                        (entries_1[0].post)->value);
      iVar1 = strarray_cmp(entries_1[1].post,&value_2);
      cunit_named_check(iVar1 == 0,"handler_add_section",0xa4,"Unknown post data for key 1: %s",
                        (entries_1[1].post)->value);
      return;
    }
  }
  return;
}

Assistant:

static void
handler_add_section(void) {
  callback_counter++;

  CHECK_TRUE(callback_counter == 1, "Callback was called %d times!", callback_counter);
  if (callback_counter > 1) {
    return;
  }
  CHECK_TRUE(handler_1.pre == NULL, "Unknown pre named-section found.");
  CHECK_TRUE(handler_1.post != NULL, "No post named-section found.");

  if (handler_1.post == NULL) {
    return;
  }

  CHECK_TRUE(handler_1.post->name != NULL && strcmp(handler_1.post->name, NAME_1) == 0,
      "Illegal name of changed section: %s", handler_1.post->name);

  CHECK_TRUE( entries_1[0].delta_changed, "Key 1 did not change!");
  CHECK_TRUE( entries_1[1].delta_changed, "Key 2 did not change!");
  CHECK_TRUE(!entries_1[2].delta_changed, "Key 3 did change!");

  CHECK_TRUE(strarray_cmp_c(entries_1[0].post, &value_1) == 0,
      "Unknown post data for key 1: %s", entries_1[0].post->value);
  CHECK_TRUE(strarray_cmp_c(entries_1[1].post, &value_2) == 0,
      "Unknown post data for key 1: %s", entries_1[1].post->value);
}